

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::UnknownFieldSerializerLite
               (uint8_t *ptr,uint32_t offset,uint32_t param_3,uint32_t param_4,
               CodedOutputStream *output)

{
  uint size;
  undefined8 *puVar1;
  uint8_t *puVar2;
  
  if ((*(ulong *)(ptr + offset) & 1) == 0) {
    puVar1 = &fixed_address_empty_string;
    if ((init_protobuf_defaults_state & 1) == 0) {
      InitProtobufDefaultsSlow();
    }
  }
  else {
    puVar1 = (undefined8 *)((*(ulong *)(ptr + offset) & 0xfffffffffffffffe) + 8);
  }
  size = *(uint *)(puVar1 + 1);
  puVar2 = output->cur_;
  if ((long)(output->impl_).end_ - (long)puVar2 < (long)(int)size) {
    puVar2 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,(void *)*puVar1,size,puVar2);
  }
  else {
    memcpy(puVar2,(void *)*puVar1,(ulong)size);
    puVar2 = puVar2 + (int)size;
  }
  output->cur_ = puVar2;
  return;
}

Assistant:

void UnknownFieldSerializerLite(const uint8_t* ptr, uint32_t offset,
                                uint32_t /*tag*/, uint32_t /*has_offset*/,
                                io::CodedOutputStream* output) {
  output->WriteString(
      reinterpret_cast<const InternalMetadata*>(ptr + offset)
          ->unknown_fields<std::string>(&internal::GetEmptyString));
}